

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  LY_DATA_TYPE LVar1;
  lys_tpdf *plVar2;
  lys_node_leaf *plVar3;
  undefined8 uVar4;
  lys_ext_instance **pplVar5;
  lys_module *plVar6;
  lys_restr *plVar7;
  lys_node *plVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  LY_ERR *pLVar12;
  lys_type *plVar13;
  lys_tpdf *plVar14;
  lyd_node_leaf_list local_90;
  lys_module *local_48;
  lys_node *local_40;
  char *local_38;
  
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0xbdf,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  LVar1 = type->base;
  if (LVar1 < LY_TYPE_BINARY) {
    return 1;
  }
  iVar10 = 0;
  if (tpdf != 0 && LVar1 == LY_TYPE_LEAFREF) {
    return 0;
  }
  local_38 = *value;
  if (local_38 == (char *)0x0) {
    plVar2 = type->der;
    do {
      plVar14 = plVar2;
      plVar2 = (plVar14->type).der;
      if (plVar2 == (lys_tpdf *)0x0) {
        return 0;
      }
      local_38 = plVar14->dflt;
    } while (local_38 == (char *)0x0);
    switch(LVar1) {
    case LY_TYPE_BINARY:
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      plVar3 = (lys_node_leaf *)(type->info).bits.bit;
joined_r0x0011d066:
      if (plVar3 == (lys_node_leaf *)0x0) {
        return 0;
      }
      break;
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
      if ((type->info).bits.count == 0) {
        return 0;
      }
      break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
    case LY_TYPE_LEAFREF:
      goto switchD_0011ce3d_caseD_3;
    case LY_TYPE_STRING:
      if ((type->info).bits.bit == (lys_type_bit *)0x0) {
        plVar3 = (type->info).lref.target;
        goto joined_r0x0011d066;
      }
      break;
    case LY_TYPE_UNION:
      break;
    default:
      pLVar12 = ly_errno_location();
      *pLVar12 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,0xc2c);
      goto LAB_0011cf72;
    }
switchD_0011ce3d_caseD_b:
    pcVar9 = local_38;
    local_90.parent = (lyd_node *)0x0;
    local_90.value.binary = (char *)0x0;
    local_90.next = (lyd_node *)0x0;
    local_90.prev = (lyd_node *)0x0;
    local_90.validity = '\0';
    local_90._9_7_ = 0;
    local_90.attr = (lyd_attr *)0x0;
    local_90._66_6_ = 0;
    local_90.value_type = (ushort)LVar1;
    local_90.value_str = local_38;
    local_48 = module;
    local_90.schema = (lys_node *)calloc(1,200);
    if (local_90.schema == (lys_node *)0x0) {
      pLVar12 = ly_errno_location();
      *pLVar12 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
    }
    else {
      local_40 = local_90.schema;
      pcVar11 = strdup("fake-default");
      plVar8 = local_40;
      local_40->name = pcVar11;
      if (pcVar11 != (char *)0x0) {
        local_40->module = local_48;
        uVar4._0_4_ = type->base;
        uVar4._4_1_ = type->ext_size;
        uVar4._5_3_ = *(undefined3 *)&type->field_0xd;
        pplVar5 = type->ext;
        plVar2 = type->der;
        plVar6 = (lys_module *)type->parent;
        plVar7 = (type->info).binary.length;
        plVar3 = (type->info).lref.target;
        plVar8 = (lys_node *)(type->info).dec64.div;
        local_40[1].ref = type->module_name;
        local_40[1].flags = (short)(undefined4)uVar4;
        local_40[1].ext_size = (char)((ulong)uVar4 >> 0x10);
        local_40[1].iffeature_size = (char)((ulong)uVar4 >> 0x18);
        local_40[1].padding[0] = (char)((ulong)uVar4 >> 0x20);
        local_40[1].padding[1] = (char)((ulong)uVar4 >> 0x28);
        local_40[1].padding[2] = (char)((ulong)uVar4 >> 0x30);
        local_40[1].padding[3] = (char)((ulong)uVar4 >> 0x38);
        local_40[1].ext = pplVar5;
        local_40[1].iffeature = (lys_iffeature *)plVar2;
        local_40[1].module = plVar6;
        *(lys_restr **)&local_40[1].nodetype = plVar7;
        local_40[1].parent = (lys_node *)plVar3;
        local_40[1].child = plVar8;
        if (LVar1 == LY_TYPE_LEAFREF) {
          plVar3 = (type->info).lref.target;
          if (plVar3 == (lys_node_leaf *)0x0) {
LAB_0011d006:
            iVar10 = 1;
            goto LAB_0011d00b;
          }
          iVar10 = check_default(&plVar3->type,&local_38,local_48,0);
          if (iVar10 != 0) goto LAB_0011d00b;
          pcVar11 = local_38;
          if (*value != (char *)0x0) goto LAB_0011cfb9;
        }
        else {
          plVar13 = lyp_parse_value((lys_type *)&local_40[1].ref,&local_90.value_str,
                                    (lyxml_elem *)0x0,&local_90,(lyd_attr *)0x0,1,1);
          if (plVar13 == (lys_type *)0x0) {
            if ((plVar14 != (lys_tpdf *)0x0) &&
               (((type->base == LY_TYPE_ENUM || (type->base == LY_TYPE_BITS)) &&
                ((type->der->type).der != (lys_tpdf *)0x0)))) {
              ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                      "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                      ,pcVar9,type->parent->name,plVar14->name);
            }
            goto LAB_0011d006;
          }
          if (pcVar9 != local_90.value_str) {
            pcVar11 = local_90.value_str;
            if (pcVar9 != *value) {
              __assert_fail("dflt == *value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                            ,0xc66,
                            "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                           );
            }
LAB_0011cfb9:
            *value = pcVar11;
          }
        }
        iVar10 = 0;
LAB_0011d00b:
        if (local_90.value_type == 2) {
          free(local_90.value.binary);
        }
        free((local_90.schema)->name);
        free(local_90.schema);
        return iVar10;
      }
      pLVar12 = ly_errno_location();
      *pLVar12 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","check_default");
      free(plVar8);
    }
  }
  else {
    if (LVar1 != LY_TYPE_EMPTY) {
      plVar14 = (lys_tpdf *)0x0;
      goto switchD_0011ce3d_caseD_b;
    }
    ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default",type->parent->name);
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"The \"empty\" data type cannot have a default value."
           );
  }
LAB_0011cf72:
  iVar10 = -1;
switchD_0011ce3d_caseD_3:
  return iVar10;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    int ret = EXIT_SUCCESS;

    assert(value);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        return EXIT_FAILURE;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        return EXIT_SUCCESS;
    }

    dflt = *value;
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = base_tpdf->dflt;
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            return EXIT_SUCCESS;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            return EXIT_SUCCESS;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            return EXIT_SUCCESS;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT;
            return -1;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        return -1;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = dflt;
    node.value_type = type->base;
    node.schema = calloc(1, sizeof (struct lys_node_leaf));
    if (!node.schema) {
        LOGMEM;
        return -1;
    }
    node.schema->name = strdup("fake-default");
    if (!node.schema->name) {
        LOGMEM;
        free(node.schema);
        return -1;
    }
    node.schema->module = module;
    memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            goto finish;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                *value = dflt;
            }
        }
    } else {
        if (!lyp_parse_value(&((struct lys_node_leaf *)node.schema)->type, &node.value_str, NULL, &node, NULL, 1, 1)) {
            /* possible forward reference */
            ret = 1;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (dflt != node.value_str) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(dflt == *value);
                *value = node.value_str;
            }
        }
    }

finish:
    if (node.value_type == LY_TYPE_BITS) {
        free(node.value.bit);
    }
    free((char *)node.schema->name);
    free(node.schema);

    return ret;
}